

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::load_rle_data(TGAImage *this,ifstream *in)

{
  value_type vVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  reference pvVar5;
  ulong local_60;
  size_t t_1;
  size_t i_1;
  size_t t;
  size_t i;
  uint8_t chunkheader;
  size_type sStack_38;
  TGAColor colorbuffer;
  size_t currentbyte;
  size_t currentpixel;
  size_t pixelcount;
  ifstream *in_local;
  TGAImage *this_local;
  
  uVar3 = (ulong)(this->width * this->height);
  currentbyte = 0;
  sStack_38 = 0;
  TGAColor::TGAColor((TGAColor *)((long)&i + 3));
  do {
    i._2_1_ = 0;
    i._2_1_ = std::istream::get();
    uVar4 = std::ios::good();
    if ((uVar4 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"an error occurred while reading the data\n");
      return false;
    }
    if (i._2_1_ < 0x80) {
      i._2_1_ = i._2_1_ + 1;
      for (t = 0; t < i._2_1_; t = t + 1) {
        std::istream::read((char *)in,(long)&i + 3);
        uVar4 = std::ios::good();
        if ((uVar4 & 1) == 0) {
          std::operator<<((ostream *)&std::cerr,"an error occurred while reading the header\n");
          return false;
        }
        for (i_1 = 0; sVar2 = sStack_38, i_1 < this->bytespp; i_1 = i_1 + 1) {
          vVar1 = *(value_type *)((long)&i + i_1 + 3);
          sStack_38 = sStack_38 + 1;
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->data,sVar2);
          *pvVar5 = vVar1;
        }
        currentbyte = currentbyte + 1;
        if (uVar3 < currentbyte) {
          std::operator<<((ostream *)&std::cerr,"Too many pixels read\n");
          return false;
        }
      }
    }
    else {
      i._2_1_ = i._2_1_ + 0x81;
      std::istream::read((char *)in,(long)&i + 3);
      uVar4 = std::ios::good();
      if ((uVar4 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"an error occurred while reading the header\n");
        return false;
      }
      for (t_1 = 0; t_1 < i._2_1_; t_1 = t_1 + 1) {
        for (local_60 = 0; sVar2 = sStack_38, local_60 < this->bytespp; local_60 = local_60 + 1) {
          vVar1 = *(value_type *)((long)&i + local_60 + 3);
          sStack_38 = sStack_38 + 1;
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->data,sVar2);
          *pvVar5 = vVar1;
        }
        currentbyte = currentbyte + 1;
        if (uVar3 < currentbyte) {
          std::operator<<((ostream *)&std::cerr,"Too many pixels read\n");
          return false;
        }
      }
    }
    if (uVar3 <= currentbyte) {
      return true;
    }
  } while( true );
}

Assistant:

bool TGAImage::load_rle_data(std::ifstream &in)
{
    size_t pixelcount = width * height;
    size_t currentpixel = 0;
    size_t currentbyte = 0;
    TGAColor colorbuffer;
    do {
        std::uint8_t chunkheader = 0;
        chunkheader = in.get();
        if (!in.good()) {
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
        if (chunkheader < 128) {
            chunkheader++;
            for (size_t i = 0; i < chunkheader; i++) {
                in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
                if (!in.good()) {
                    std::cerr << "an error occurred while reading the header\n";
                    return false;
                }
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        } else {
            chunkheader -= 127;
            in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
            if (!in.good()) {
                std::cerr << "an error occurred while reading the header\n";
                return false;
            }
            for (size_t i = 0; i < chunkheader; i++) {
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        }
    } while (currentpixel < pixelcount);
    return true;
}